

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conversion.cpp
# Opt level: O1

string_type * __thiscall
booster::locale::impl_icu::converter_impl<wchar_t>::convert_abi_cxx11_
          (string_type *__return_storage_ptr__,converter_impl<wchar_t> *this,conversion_type how,
          char_type_conflict *begin,char_type_conflict *end,int flags)

{
  pointer pcVar1;
  icu_std_converter<wchar_t,_4> cvt;
  UnicodeString str;
  char_type_conflict local_a0;
  int local_9c;
  char_type_conflict *local_98;
  icu_std_converter<wchar_t,_4> local_90 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  pcVar1 = (this->encoding_)._M_dataplus._M_p;
  local_9c = flags;
  local_98 = end;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar1,pcVar1 + (this->encoding_)._M_string_length);
  local_a0 = 0;
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  icu_std_converter<wchar_t,_4>::icu(local_90,&local_a0,begin);
  switch(how) {
  case normalization:
    anon_unknown_12::normalize_string((UnicodeString *)local_90,local_9c);
    break;
  case upper_case:
    icu_70::UnicodeString::toUpper((Locale *)local_90);
    break;
  case lower_case:
    icu_70::UnicodeString::toLower((Locale *)local_90);
    break;
  case case_folding:
    icu_70::UnicodeString::foldCase((uint)local_90);
    break;
  case title_case:
    icu_70::UnicodeString::toTitle((BreakIterator *)local_90,(Locale *)0x0);
  }
  icu_std_converter<wchar_t,4>::std_abi_cxx11_
            (__return_storage_ptr__,&local_a0,(UnicodeString *)local_90);
  icu_70::UnicodeString::~UnicodeString((UnicodeString *)local_90);
  return __return_storage_ptr__;
}

Assistant:

virtual string_type convert(converter_base::conversion_type how,char_type const *begin,char_type const *end,int flags = 0) const
        {
            icu_std_converter<char_type> cvt(encoding_);
            icu::UnicodeString str=cvt.icu(begin,end);
            switch(how) {
            case converter_base::normalization:
                normalize_string(str,flags);
                break;
            case converter_base::upper_case:
                str.toUpper(locale_);
                break;
            case converter_base::lower_case:
                str.toLower(locale_);
                break;
            case converter_base::title_case:
                str.toTitle(0,locale_);
                break;
            case converter_base::case_folding:
                str.foldCase();
                break;
            default:
                ;
            }
            return cvt.std(str);
        }